

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

uchar * stbi_zlib_compress(uchar *data,int data_len,int *out_len,int quality)

{
  byte *pbVar1;
  void **arr;
  byte bVar2;
  long lVar3;
  bool bVar4;
  uchar *puVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int itemsize;
  int itemsize_00;
  int iVar10;
  int extraout_EDX;
  int extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint itemsize_01;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar11;
  ulong extraout_RDX_02;
  undefined2 uVar12;
  uint uVar13;
  void *__dest;
  uint uVar14;
  undefined4 in_register_00000034;
  long lVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  int *piVar21;
  undefined2 uVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  int local_88;
  uint local_84;
  uchar *local_80;
  undefined8 local_78;
  void *local_70;
  int local_68;
  int local_64;
  int *local_60;
  ulong local_58;
  ulong local_50;
  size_t local_48;
  ulong local_40;
  uchar *local_38;
  
  local_78 = CONCAT44(in_register_00000034,data_len);
  local_80 = (uchar *)0x0;
  local_70 = malloc(0x20000);
  if (local_70 == (void *)0x0) {
    return (uchar *)0x0;
  }
  local_58 = 5;
  if (5 < quality) {
    local_58 = (ulong)(uint)quality;
  }
  local_60 = out_len;
  stbiw__sbgrowf(&local_80,1,itemsize);
  iVar10 = *(int *)(local_80 + -4);
  *(int *)(local_80 + -4) = iVar10 + 1;
  local_80[iVar10] = 'x';
  iVar9 = *(int *)(local_80 + -4);
  iVar10 = iVar9 + 1;
  if (*(int *)(local_80 + -8) <= iVar10) {
    stbiw__sbgrowf(&local_80,1,itemsize_00);
    iVar9 = *(int *)(local_80 + -4);
    iVar10 = iVar9 + 1;
  }
  *(int *)(local_80 + -4) = iVar10;
  local_80[iVar9] = '^';
  local_84 = 1;
  local_88 = 1;
  puVar5 = stbiw__zlib_flushf(local_80,&local_84,&local_88);
  local_84 = local_84 | 1 << ((byte)local_88 & 0x1f);
  local_88 = local_88 + 2;
  puVar5 = stbiw__zlib_flushf(puVar5,&local_84,&local_88);
  uVar7 = 0;
  local_80 = puVar5;
  memset(local_70,0,0x20000);
  if (3 < (int)local_78) {
    local_64 = (int)local_78 + -3;
    local_68 = (int)local_58 * 2;
    local_40 = local_58 & 0xffffffff;
    local_48 = local_40 * 8;
    uVar18 = 0;
    uVar11 = extraout_RDX;
    do {
      iVar10 = (int)uVar11;
      iVar9 = (int)uVar18;
      pbVar1 = data + iVar9;
      uVar7 = (uint)CONCAT12(data[(long)iVar9 + 2],*(undefined2 *)(data + iVar9)) * 8 ^
              (uint)CONCAT12(data[(long)iVar9 + 2],*(undefined2 *)(data + iVar9));
      uVar7 = (uVar7 >> 5) + uVar7;
      uVar7 = uVar7 * 0x10 ^ uVar7;
      uVar7 = (uVar7 >> 0x11) + uVar7;
      uVar20 = (ulong)((uVar7 >> 6) + uVar7 & 0x3fff);
      __dest = *(void **)((long)local_70 + uVar20 * 8);
      local_50 = uVar18;
      local_38 = puVar5;
      if (__dest == (void *)0x0) {
        iVar24 = 3;
        lVar25 = 0;
LAB_001b217f:
        arr = (void **)((long)local_70 + uVar20 * 8);
        stbiw__sbgrowf(arr,8,iVar10);
        __dest = *arr;
        iVar9 = *(int *)((long)__dest + -4);
        iVar8 = iVar9 + 1;
      }
      else {
        if ((long)*(int *)((long)__dest + -4) < 1) {
          iVar24 = 3;
          lVar25 = 0;
        }
        else {
          iVar10 = (int)local_78 - iVar9;
          uVar7 = iVar10 - 1;
          if (0x100 < uVar7) {
            uVar7 = 0x101;
          }
          iVar24 = 3;
          lVar15 = 0;
          lVar25 = 0;
          do {
            lVar19 = *(long *)((long)__dest + lVar15 * 8);
            if ((long)(iVar9 + -0x8000) < lVar19 - (long)data) {
              uVar18 = 0;
              if (0 < iVar10) {
                do {
                  if (*(byte *)(lVar19 + uVar18) != pbVar1[uVar18]) goto LAB_001b2124;
                  uVar18 = uVar18 + 1;
                } while (uVar7 + 1 != uVar18);
                uVar18 = (ulong)(uVar7 + 1);
              }
LAB_001b2124:
              iVar17 = (int)uVar18;
              iVar8 = iVar24;
              if (iVar24 < iVar17) {
                iVar8 = iVar17;
              }
              bVar4 = iVar24 <= iVar17;
              iVar24 = iVar8;
              if (bVar4) {
                lVar25 = lVar19;
              }
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 != *(int *)((long)__dest + -4));
          if (__dest == (void *)0x0) goto LAB_001b217f;
        }
        iVar9 = *(int *)((long)__dest + -4);
        if (iVar9 == local_68) {
          memmove(__dest,(void *)((long)__dest + local_40 * 8),local_48);
          iVar9 = (int)local_58;
          *(int *)((long)__dest + -4) = iVar9;
          iVar10 = extraout_EDX;
        }
        iVar8 = iVar9 + 1;
        if (*(int *)((long)__dest + -8) <= iVar8) goto LAB_001b217f;
      }
      *(int *)((long)__dest + -4) = iVar8;
      *(byte **)((long)__dest + (long)iVar9 * 8) = pbVar1;
      bVar6 = (byte)local_88;
      if (lVar25 == 0) {
LAB_001b22bf:
        bVar2 = *pbVar1;
        if (bVar2 < 0x90) {
          uVar7 = bVar2 + 0x30;
          iVar10 = 0;
          iVar9 = -8;
          do {
            iVar10 = (uVar7 & 1) + iVar10 * 2;
            uVar7 = uVar7 >> 1;
            iVar9 = iVar9 + 1;
          } while (iVar9 != 0);
          uVar7 = iVar10 << (bVar6 & 0x1f);
          local_88 = local_88 + 8;
        }
        else {
          uVar7 = bVar2 | 0x100;
          iVar10 = 0;
          iVar9 = -9;
          do {
            iVar10 = (uVar7 & 1) + iVar10 * 2;
            uVar7 = uVar7 >> 1;
            iVar9 = iVar9 + 1;
          } while (iVar9 != 0);
          uVar7 = iVar10 << (bVar6 & 0x1f);
          local_88 = local_88 + 9;
        }
        local_84 = local_84 | uVar7;
        iVar24 = 1;
        puVar5 = local_38;
LAB_001b2433:
        puVar5 = stbiw__zlib_flushf(puVar5,&local_84,&local_88);
        uVar11 = extraout_RDX_01;
      }
      else {
        uVar7 = (uint)*(uint3 *)(pbVar1 + 1) * 8 ^ (uint)*(uint3 *)(pbVar1 + 1);
        uVar7 = (uVar7 >> 5) + uVar7;
        uVar7 = uVar7 * 0x10 ^ uVar7;
        uVar7 = (uVar7 >> 0x11) + uVar7;
        lVar15 = *(long *)((long)local_70 + (ulong)((uVar7 >> 6) + uVar7 & 0x3fff) * 8);
        if ((lVar15 != 0) && (0 < (long)*(int *)(lVar15 + -4))) {
          uVar16 = ~(uint)local_50;
          uVar7 = (uVar16 + (int)local_78) - 1;
          if (0x100 < uVar7) {
            uVar7 = 0x101;
          }
          lVar19 = 0;
          do {
            lVar3 = *(long *)(lVar15 + lVar19 * 8);
            if ((long)(int)((uint)local_50 - 0x7fff) < lVar3 - (long)data) {
              uVar18 = 0;
              if (0 < (int)(uVar16 + (int)local_78)) {
                do {
                  if (*(byte *)(lVar3 + uVar18) != pbVar1[uVar18 + 1]) goto LAB_001b2267;
                  uVar18 = uVar18 + 1;
                } while (uVar7 + 1 != uVar18);
                uVar18 = (ulong)(uVar7 + 1);
              }
LAB_001b2267:
              if (iVar24 < (int)uVar18) goto LAB_001b22bf;
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 != *(int *)(lVar15 + -4));
        }
        iVar10 = (int)pbVar1 - (int)lVar25;
        uVar18 = 0;
        do {
          uVar20 = uVar18;
          uVar18 = uVar20 + 1;
        } while ((int)(uint)stbi_zlib_compress::lengthc[uVar20 + 1] <= iVar24);
        if (uVar20 < 0x17) {
          iVar9 = 0;
          iVar8 = -7;
          do {
            iVar9 = ((uint)uVar18 & 1) + iVar9 * 2;
            uVar18 = (ulong)((uint)uVar18 >> 1);
            iVar8 = iVar8 + 1;
          } while (iVar8 != 0);
          uVar7 = iVar9 << (bVar6 & 0x1f);
          local_88 = local_88 + 7;
        }
        else {
          uVar7 = (int)uVar18 + 0xa8;
          iVar9 = 0;
          iVar8 = -8;
          do {
            iVar9 = (uVar7 & 1) + iVar9 * 2;
            uVar7 = uVar7 >> 1;
            iVar8 = iVar8 + 1;
          } while (iVar8 != 0);
          uVar7 = iVar9 << (bVar6 & 0x1f);
          local_88 = local_88 + 8;
        }
        local_84 = local_84 | uVar7;
        puVar5 = stbiw__zlib_flushf(local_38,&local_84,&local_88);
        uVar20 = uVar20 & 0xffffffff;
        if (0xffffffffffffffeb < uVar20 - 0x1c) {
          local_84 = local_84 |
                     iVar24 - (uint)stbi_zlib_compress::lengthc[uVar20] << ((byte)local_88 & 0x1f);
          local_88 = (uint)""[uVar20] + local_88;
          puVar5 = stbiw__zlib_flushf(puVar5,&local_84,&local_88);
        }
        uVar18 = 0xffffffffffffffff;
        do {
          lVar25 = uVar18 + 2;
          uVar18 = uVar18 + 1;
        } while ((int)(uint)stbi_zlib_compress::distc[lVar25] <= iVar10);
        iVar9 = 0;
        iVar8 = -5;
        uVar20 = uVar18 & 0xffffffff;
        do {
          iVar9 = ((uint)uVar20 & 1) + iVar9 * 2;
          uVar20 = uVar20 >> 1;
          iVar8 = iVar8 + 1;
        } while (iVar8 != 0);
        local_84 = local_84 | iVar9 << ((byte)local_88 & 0x1f);
        local_88 = local_88 + 5;
        puVar5 = stbiw__zlib_flushf(puVar5,&local_84,&local_88);
        uVar11 = extraout_RDX_00;
        if (3 < uVar18) {
          local_84 = local_84 |
                     iVar10 - (uint)stbi_zlib_compress::distc[uVar18 & 0xffffffff] <<
                     ((byte)local_88 & 0x1f);
          local_88 = (uint)""[uVar18 & 0xffffffff] + local_88;
          goto LAB_001b2433;
        }
      }
      uVar7 = iVar24 + (int)local_50;
      uVar18 = (ulong)uVar7;
    } while ((int)uVar7 < local_64);
  }
  if ((int)uVar7 < (int)local_78) {
    lVar25 = (long)(int)uVar7;
    local_80 = puVar5;
    do {
      bVar6 = data[lVar25];
      if (bVar6 < 0x90) {
        uVar7 = bVar6 + 0x30;
        iVar10 = 0;
        iVar9 = -8;
        do {
          iVar10 = (uVar7 & 1) + iVar10 * 2;
          uVar7 = uVar7 >> 1;
          iVar9 = iVar9 + 1;
        } while (iVar9 != 0);
        uVar7 = iVar10 << ((byte)local_88 & 0x1f);
        local_88 = local_88 + 8;
      }
      else {
        uVar7 = bVar6 | 0x100;
        iVar10 = 0;
        iVar9 = -9;
        do {
          iVar10 = (uVar7 & 1) + iVar10 * 2;
          uVar7 = uVar7 >> 1;
          iVar9 = iVar9 + 1;
        } while (iVar9 != 0);
        uVar7 = iVar10 << ((byte)local_88 & 0x1f);
        local_88 = local_88 + 9;
      }
      local_84 = local_84 | uVar7;
      puVar5 = stbiw__zlib_flushf(puVar5,&local_84,&local_88);
      lVar25 = lVar25 + 1;
    } while ((int)lVar25 != (int)local_78);
  }
  local_88 = local_88 + 7;
  local_80 = puVar5;
  puVar5 = stbiw__zlib_flushf(puVar5,&local_84,&local_88);
  uVar11 = local_78;
  if (local_88 != 0) {
    do {
      local_88 = local_88 + 1;
      puVar5 = stbiw__zlib_flushf(puVar5,&local_84,&local_88);
    } while (local_88 != 0);
  }
  uVar7 = (uint)uVar11;
  lVar25 = 0;
  local_80 = puVar5;
  do {
    lVar15 = *(long *)((long)local_70 + lVar25 * 8);
    if (lVar15 != 0) {
      free((void *)(lVar15 + -8));
    }
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x4000);
  free(local_70);
  iVar10 = *(int *)(puVar5 + -4);
  iVar9 = (int)((ulong)((long)(int)(uVar7 + 0x7ffe) * -0x7ffefffd) >> 0x20) + uVar7 + 0x7ffe;
  uVar16 = -(iVar9 >> 0x1f);
  uVar18 = (ulong)uVar16;
  if ((int)(((iVar9 >> 0xe) + uVar16) * 5 + uVar7 + 2) < iVar10) {
    puVar5[-4] = '\x02';
    puVar5[-3] = '\0';
    puVar5[-2] = '\0';
    puVar5[-1] = '\0';
    if (0 < (int)uVar7) {
      iVar9 = 0;
      iVar10 = 2;
      do {
        iVar24 = (int)uVar18;
        uVar7 = (int)uVar11 - iVar9;
        uVar13 = 0x7fff;
        if ((int)uVar7 < 0x7fff) {
          uVar13 = uVar7;
        }
        iVar8 = iVar10 + 1;
        if (*(int *)(puVar5 + -8) <= iVar8) {
          stbiw__sbgrowf(&local_80,1,iVar24);
          iVar10 = *(int *)(local_80 + -4);
          iVar8 = iVar10 + 1;
          puVar5 = local_80;
          iVar24 = extraout_EDX_00;
        }
        *(int *)(puVar5 + -4) = iVar8;
        puVar5[iVar10] = (int)uVar7 < 0x8000;
        if (*(int *)(puVar5 + -8) <= *(int *)(puVar5 + -4) + 1) {
          stbiw__sbgrowf(&local_80,1,iVar24);
        }
        uVar11 = local_78;
        iVar10 = *(int *)(local_80 + -4);
        *(int *)(local_80 + -4) = iVar10 + 1;
        local_80[iVar10] = (uchar)uVar13;
        iVar24 = *(int *)(local_80 + -4);
        iVar10 = iVar24 + 1;
        uVar7 = (uint)local_78;
        if (*(int *)(local_80 + -8) <= iVar10) {
          stbiw__sbgrowf(&local_80,1,iVar10);
          iVar24 = *(int *)(local_80 + -4);
          iVar10 = iVar24 + 1;
        }
        *(int *)(local_80 + -4) = iVar10;
        local_80[iVar24] = (uchar)(uVar13 >> 8);
        iVar24 = *(int *)(local_80 + -4);
        iVar10 = iVar24 + 1;
        if (*(int *)(local_80 + -8) <= iVar10) {
          stbiw__sbgrowf(&local_80,1,iVar10);
          iVar24 = *(int *)(local_80 + -4);
          iVar10 = iVar24 + 1;
        }
        *(int *)(local_80 + -4) = iVar10;
        local_80[iVar24] = (uchar)~uVar13;
        if (*(int *)(local_80 + -8) <= *(int *)(local_80 + -4) + 1) {
          stbiw__sbgrowf(&local_80,1,iVar10);
        }
        puVar5 = local_80;
        iVar10 = *(int *)(local_80 + -4);
        *(int *)(local_80 + -4) = iVar10 + 1;
        local_80[iVar10] = (uchar)(~uVar13 >> 8);
        memcpy(local_80 + *(int *)(local_80 + -4),data + iVar9,(long)(int)uVar13);
        uVar16 = (uint)extraout_RDX_02;
        iVar10 = *(int *)(puVar5 + -4) + uVar13;
        *(int *)(puVar5 + -4) = iVar10;
        iVar9 = iVar9 + uVar13;
        uVar18 = extraout_RDX_02;
      } while (iVar9 < (int)uVar7);
      goto LAB_001b2704;
    }
    iVar10 = 2;
    uVar23 = 1;
    uVar13 = 0;
LAB_001b27b1:
    itemsize_01 = uVar16;
    uVar22 = (undefined2)uVar23;
    uVar12 = (undefined2)uVar13;
    iVar9 = iVar10 + 1;
    piVar21 = local_60;
    if (iVar9 < *(int *)(puVar5 + -8)) goto LAB_001b27d4;
  }
  else {
LAB_001b2704:
    if ((int)uVar7 < 1) {
      uVar23 = 1;
      uVar13 = 0;
      goto LAB_001b27b1;
    }
    uVar16 = uVar7 % 0x15b0;
    uVar23 = 1;
    uVar13 = 0;
    itemsize_01 = 0x80078071;
    uVar18 = 0;
    do {
      if (uVar16 != 0) {
        uVar20 = 0;
        do {
          uVar23 = uVar23 + data[uVar20 + uVar18];
          uVar13 = uVar13 + uVar23;
          uVar20 = uVar20 + 1;
        } while (uVar16 != uVar20);
        uVar23 = uVar23 % 0xfff1;
        uVar13 = uVar13 % 0xfff1;
      }
      uVar14 = (int)uVar18 + uVar16;
      uVar18 = (ulong)uVar14;
      uVar16 = 0x15b0;
    } while ((int)uVar14 < (int)uVar7);
    uVar16 = 0x80078071;
    if (puVar5 != (uchar *)0x0) goto LAB_001b27b1;
  }
  piVar21 = local_60;
  uVar22 = (undefined2)uVar23;
  uVar12 = (undefined2)uVar13;
  stbiw__sbgrowf(&local_80,1,itemsize_01);
  iVar10 = *(int *)(local_80 + -4);
  iVar9 = iVar10 + 1;
  puVar5 = local_80;
  itemsize_01 = extraout_EDX_01;
LAB_001b27d4:
  *(int *)(puVar5 + -4) = iVar9;
  puVar5[iVar10] = (uchar)((ushort)uVar12 >> 8);
  if (*(int *)(puVar5 + -8) <= *(int *)(puVar5 + -4) + 1) {
    stbiw__sbgrowf(&local_80,1,itemsize_01);
    itemsize_01 = extraout_EDX_02;
  }
  iVar10 = *(int *)(local_80 + -4);
  *(int *)(local_80 + -4) = iVar10 + 1;
  local_80[iVar10] = (uchar)uVar12;
  iVar9 = *(int *)(local_80 + -4);
  iVar10 = iVar9 + 1;
  if (*(int *)(local_80 + -8) <= iVar10) {
    stbiw__sbgrowf(&local_80,1,itemsize_01);
    iVar9 = *(int *)(local_80 + -4);
    iVar10 = iVar9 + 1;
    itemsize_01 = extraout_EDX_03;
  }
  *(int *)(local_80 + -4) = iVar10;
  local_80[iVar9] = (uchar)((ushort)uVar22 >> 8);
  iVar9 = *(int *)(local_80 + -4);
  iVar10 = iVar9 + 1;
  if (*(int *)(local_80 + -8) <= iVar10) {
    stbiw__sbgrowf(&local_80,1,itemsize_01);
    iVar9 = *(int *)(local_80 + -4);
    iVar10 = iVar9 + 1;
  }
  *(int *)(local_80 + -4) = iVar10;
  local_80[iVar9] = (uchar)uVar22;
  iVar10 = *(int *)(local_80 + -4);
  *piVar21 = iVar10;
  puVar5 = (uchar *)memmove(local_80 + -8,local_80,(long)iVar10);
  return puVar5;
}

Assistant:

STBIWDEF unsigned char * stbi_zlib_compress(unsigned char *data, int data_len, int *out_len, int quality)
{
#ifdef STBIW_ZLIB_COMPRESS
   // user provided a zlib compress implementation, use that
   return STBIW_ZLIB_COMPRESS(data, data_len, out_len, quality);
#else // use builtin
   static unsigned short lengthc[] = { 3,4,5,6,7,8,9,10,11,13,15,17,19,23,27,31,35,43,51,59,67,83,99,115,131,163,195,227,258, 259 };
   static unsigned char  lengtheb[]= { 0,0,0,0,0,0,0, 0, 1, 1, 1, 1, 2, 2, 2, 2, 3, 3, 3, 3, 4, 4, 4,  4,  5,  5,  5,  5,  0 };
   static unsigned short distc[]   = { 1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193,257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577, 32768 };
   static unsigned char  disteb[]  = { 0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,10,10,11,11,12,12,13,13 };
   unsigned int bitbuf=0;
   int i,j, bitcount=0;
   unsigned char *out = NULL;
   unsigned char ***hash_table = (unsigned char***) STBIW_MALLOC(stbiw__ZHASH * sizeof(unsigned char**));
   if (hash_table == NULL)
      return NULL;
   if (quality < 5) quality = 5;

   stbiw__sbpush(out, 0x78);   // DEFLATE 32K window
   stbiw__sbpush(out, 0x5e);   // FLEVEL = 1
   stbiw__zlib_add(1,1);  // BFINAL = 1
   stbiw__zlib_add(1,2);  // BTYPE = 1 -- fixed huffman

   for (i=0; i < stbiw__ZHASH; ++i)
      hash_table[i] = NULL;

   i=0;
   while (i < data_len-3) {
      // hash next 3 bytes of data to be compressed
      int h = stbiw__zhash(data+i)&(stbiw__ZHASH-1), best=3;
      unsigned char *bestloc = 0;
      unsigned char **hlist = hash_table[h];
      int n = stbiw__sbcount(hlist);
      for (j=0; j < n; ++j) {
         if (hlist[j]-data > i-32768) { // if entry lies within window
            int d = stbiw__zlib_countm(hlist[j], data+i, data_len-i);
            if (d >= best) { best=d; bestloc=hlist[j]; }
         }
      }
      // when hash table entry is too long, delete half the entries
      if (hash_table[h] && stbiw__sbn(hash_table[h]) == 2*quality) {
         STBIW_MEMMOVE(hash_table[h], hash_table[h]+quality, sizeof(hash_table[h][0])*quality);
         stbiw__sbn(hash_table[h]) = quality;
      }
      stbiw__sbpush(hash_table[h],data+i);

      if (bestloc) {
         // "lazy matching" - check match at *next* byte, and if it's better, do cur byte as literal
         h = stbiw__zhash(data+i+1)&(stbiw__ZHASH-1);
         hlist = hash_table[h];
         n = stbiw__sbcount(hlist);
         for (j=0; j < n; ++j) {
            if (hlist[j]-data > i-32767) {
               int e = stbiw__zlib_countm(hlist[j], data+i+1, data_len-i-1);
               if (e > best) { // if next match is better, bail on current match
                  bestloc = NULL;
                  break;
               }
            }
         }
      }

      if (bestloc) {
         int d = (int) (data+i - bestloc); // distance back
         STBIW_ASSERT(d <= 32767 && best <= 258);
         for (j=0; best > lengthc[j+1]-1; ++j);
         stbiw__zlib_huff(j+257);
         if (lengtheb[j]) stbiw__zlib_add(best - lengthc[j], lengtheb[j]);
         for (j=0; d > distc[j+1]-1; ++j);
         stbiw__zlib_add(stbiw__zlib_bitrev(j,5),5);
         if (disteb[j]) stbiw__zlib_add(d - distc[j], disteb[j]);
         i += best;
      } else {
         stbiw__zlib_huffb(data[i]);
         ++i;
      }
   }
   // write out final bytes
   for (;i < data_len; ++i)
      stbiw__zlib_huffb(data[i]);
   stbiw__zlib_huff(256); // end of block
   // pad with 0 bits to byte boundary
   while (bitcount)
      stbiw__zlib_add(0,1);

   for (i=0; i < stbiw__ZHASH; ++i)
      (void) stbiw__sbfree(hash_table[i]);
   STBIW_FREE(hash_table);

   // store uncompressed instead if compression was worse
   if (stbiw__sbn(out) > data_len + 2 + ((data_len+32766)/32767)*5) {
      stbiw__sbn(out) = 2;  // truncate to DEFLATE 32K window and FLEVEL = 1
      for (j = 0; j < data_len;) {
         int blocklen = data_len - j;
         if (blocklen > 32767) blocklen = 32767;
         stbiw__sbpush(out, data_len - j == blocklen); // BFINAL = ?, BTYPE = 0 -- no compression
         stbiw__sbpush(out, STBIW_UCHAR(blocklen)); // LEN
         stbiw__sbpush(out, STBIW_UCHAR(blocklen >> 8));
         stbiw__sbpush(out, STBIW_UCHAR(~blocklen)); // NLEN
         stbiw__sbpush(out, STBIW_UCHAR(~blocklen >> 8));
         memcpy(out+stbiw__sbn(out), data+j, blocklen);
         stbiw__sbn(out) += blocklen;
         j += blocklen;
      }
   }

   {
      // compute adler32 on input
      unsigned int s1=1, s2=0;
      int blocklen = (int) (data_len % 5552);
      j=0;
      while (j < data_len) {
         for (i=0; i < blocklen; ++i) { s1 += data[j+i]; s2 += s1; }
         s1 %= 65521; s2 %= 65521;
         j += blocklen;
         blocklen = 5552;
      }
      stbiw__sbpush(out, STBIW_UCHAR(s2 >> 8));
      stbiw__sbpush(out, STBIW_UCHAR(s2));
      stbiw__sbpush(out, STBIW_UCHAR(s1 >> 8));
      stbiw__sbpush(out, STBIW_UCHAR(s1));
   }
   *out_len = stbiw__sbn(out);
   // make returned pointer freeable
   STBIW_MEMMOVE(stbiw__sbraw(out), out, *out_len);
   return (unsigned char *) stbiw__sbraw(out);
#endif // STBIW_ZLIB_COMPRESS
}